

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_part.c
# Opt level: O0

int my_strmatch(char *big,char *little)

{
  int iVar1;
  size_t __n;
  ushort **ppuVar2;
  size_t z;
  char *little_local;
  char *big_local;
  
  __n = strlen(little);
  little_local = big;
  while( true ) {
    ppuVar2 = __ctype_b_loc();
    if (((*ppuVar2)[(int)*little_local] & 0x2000) == 0) break;
    little_local = little_local + 1;
  }
  iVar1 = strncmp(little_local,little,__n);
  if (iVar1 == 0) {
    little_local = little_local + __n;
    while( true ) {
      ppuVar2 = __ctype_b_loc();
      if (((*ppuVar2)[(int)*little_local] & 0x2000) == 0) break;
      little_local = little_local + 1;
    }
    big_local._4_4_ = (uint)(*little_local != '\0');
  }
  else {
    big_local._4_4_ = 1;
  }
  return big_local._4_4_;
}

Assistant:

static int
my_strmatch(const char *big, const char *little)
{
    size_t z = strlen(little);

    while (isspace(*big))
        big++;

    if (strncmp(big, little, z))
        return 1; /* No match */

    big += z;
    while (isspace(*big))
        big++;

    return *big != 0;
}